

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

t_pool_result * t_pool_next_result_wait(t_results_queue *q)

{
  t_pool_result *ptVar1;
  undefined1 local_38 [8];
  timespec timeout;
  timeval now;
  t_pool_result *r;
  t_results_queue *q_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&q->result_m);
  while( true ) {
    ptVar1 = t_pool_next_result_locked(q);
    if (ptVar1 != (t_pool_result *)0x0) break;
    gettimeofday((timeval *)&timeout.tv_nsec,(__timezone_ptr_t)0x0);
    local_38 = (undefined1  [8])(timeout.tv_nsec + 10);
    timeout.tv_sec = now.tv_sec * 1000;
    pthread_cond_timedwait
              ((pthread_cond_t *)&q->result_avail_c,(pthread_mutex_t *)&q->result_m,
               (timespec *)local_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&q->result_m);
  return ptVar1;
}

Assistant:

t_pool_result *t_pool_next_result_wait(t_results_queue *q) {
    t_pool_result *r;

#ifdef DEBUG
    fprintf(stderr, "Waiting for result %d...\n", q->next_serial);
#endif

    pthread_mutex_lock(&q->result_m);
    while (!(r = t_pool_next_result_locked(q))) {
	/* Possible race here now avoided via _locked() call, but incase... */
	struct timeval now;
	struct timespec timeout;

	gettimeofday(&now, NULL);
	timeout.tv_sec = now.tv_sec + 10;
	timeout.tv_nsec = now.tv_usec * 1000;

	pthread_cond_timedwait(&q->result_avail_c, &q->result_m, &timeout);
    }
    pthread_mutex_unlock(&q->result_m);

    return r;
}